

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O1

Vec_Int_t * Gia_SimAbsFind(Vec_Int_t *vValues,int Value)

{
  Vec_Int_t *p;
  int *piVar1;
  long lVar2;
  
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar1 = (int *)malloc(400);
  p->pArray = piVar1;
  if (0 < vValues->nSize) {
    lVar2 = 0;
    do {
      if (vValues->pArray[lVar2] == Value) {
        Vec_IntPush(p,(int)lVar2);
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < vValues->nSize);
  }
  return p;
}

Assistant:

Vec_Int_t * Gia_SimAbsFind( Vec_Int_t * vValues, int Value )
{
    Vec_Int_t * vSubset = Vec_IntAlloc( 100 ); int i, Entry;
    Vec_IntForEachEntry( vValues, Entry, i )
        if ( Entry == Value )
            Vec_IntPush( vSubset, i );
    return vSubset;
}